

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

uint8_t tonk::FECRateToByte(float rate)

{
  undefined1 auVar1 [16];
  int iVar2;
  int rateInt;
  float rate_local;
  undefined1 local_1;
  
  if (0.01 < rate) {
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x44000000),0),ZEXT416((uint)(rate - 0.01)),
                             SUB6416(ZEXT464(0x3f000000),0));
    iVar2 = (int)auVar1._0_4_;
    if (iVar2 < 1) {
      local_1 = '\0';
    }
    else if (iVar2 < 0xff) {
      local_1 = (uint8_t)iVar2;
    }
    else {
      local_1 = 0xff;
    }
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static uint8_t FECRateToByte(float rate)
{
    if (rate <= 0.01f) {
        return 0;
    }
    const int rateInt = static_cast<int>((rate - 0.01f) * 512.f + 0.5f);
    if (rateInt <= 0) {
        return 0;
    }
    else if (rateInt >= 255) {
        return 255;
    }
    else {
        return static_cast<uint8_t>(rateInt);
    }
}